

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O1

int TasGrid::RuleLocal::getKid<(TasGrid::RuleLocal::erule)1>(int point,int kid_number)

{
  undefined *puVar1;
  
  if (kid_number == 0) {
    if (2 < (uint)point) {
      return point * 2 + -1;
    }
    puVar1 = &DAT_001d0910;
  }
  else {
    if (2 < (uint)point) {
      return point * 2;
    }
    puVar1 = &DAT_001d091c;
  }
  return *(int *)(puVar1 + (ulong)(uint)point * 4);
}

Assistant:

int getKid(int point, int kid_number) {
        switch(effective_rule) {
            case erule::pwc:
                if (point == 0) return (kid_number == 0) ? 1 : (kid_number==1) ? 2 : -1;
                if (kid_number == 3){
                    int i3l3 = Maths::int3log3(point);
                    if (point == i3l3/3) return -1;
                    if (point == i3l3-1) return -1;
                    return (point % 2 == 0) ? 3*point + 3 : 3*point - 1;
                }
                return 3*point + kid_number;
            case erule::localp:
            case erule::semilocalp:
                if (kid_number == 0){
                    switch(point) {
                        case 0: return 1;
                        case 1: return 3;
                        case 2: return 4;
                        default:
                            return 2 * point - 1;
                    };
                } else {
                    switch(point) {
                        case 0: return 2;
                        case 1:
                        case 2: return -1;
                        default:
                            return 2 * point;
                    };
                }
            case erule::localp0:
                return 2 * point + ((kid_number == 0) ? 1 : 2);
            default: // case erule::localpb:
                switch(point) {
                    case 0:
                    case 1:
                        return (kid_number == 0) ? 2 : -1;
                    default:
                        return 2*point - ((kid_number == 0) ? 1 : 0);
                };
        };
    }